

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl.c
# Opt level: O3

cfl_predict_lbd_fn cfl_get_predict_lbd_fn_c(TX_SIZE tx_size)

{
  undefined7 in_register_00000039;
  
  return cfl_get_predict_lbd_fn_c::pred
         [(byte)(tx_size +
                (char)((uint)(((int)CONCAT71(in_register_00000039,tx_size) +
                              (int)CONCAT71(in_register_00000039,tx_size) * 8) * 3) >> 9) * -0x13)];
}

Assistant:

static inline void cfl_predict_hbd_c(const int16_t *ac_buf_q3, uint16_t *dst,
                                     int dst_stride, int alpha_q3,
                                     int bit_depth, int width, int height) {
  for (int j = 0; j < height; j++) {
    for (int i = 0; i < width; i++) {
      dst[i] = clip_pixel_highbd(
          get_scaled_luma_q0(alpha_q3, ac_buf_q3[i]) + dst[i], bit_depth);
    }
    dst += dst_stride;
    ac_buf_q3 += CFL_BUF_LINE;
  }
}